

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::readArrayBasedContainer<QList<unsigned_long_long>>
          (QDataStream *s,QList<unsigned_long_long> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  qint64 extendedLen;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<unsigned_long_long>::clear(c);
  local_48 = (undefined1 *)CONCAT44(local_48._4_4_,0xaaaaaaaa);
  QDataStream::operator>>(s,(int *)&local_48);
  asize = (undefined1 *)((ulong)local_48 & 0xffffffff);
  if (asize == (undefined1 *)0xffffffff) {
    asize = (undefined1 *)0xffffffffffffffff;
  }
  else if (((int)local_48 == -2) && (0x15 < *(int *)(s + 0x18))) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)&local_40);
    asize = local_40;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<unsigned_long_long>::reserve(c,(qsizetype)asize);
    if (asize != (undefined1 *)0x0) {
      do {
        asize = asize + -1;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        QDataStream::operator>>(s,(longlong *)&local_48);
        QVar2 = s[0x13];
        if (QVar2 == (QDataStream)0x0) {
          local_40 = local_48;
          QPodArrayOps<unsigned_long_long>::emplace<unsigned_long_long&>
                    ((QPodArrayOps<unsigned_long_long> *)c,(c->d).size,
                     (unsigned_long_long *)&local_40);
          QList<unsigned_long_long>::end(c);
        }
        else {
          QList<unsigned_long_long>::clear(c);
        }
      } while ((QVar2 == (QDataStream)0x0) && (asize != (undefined1 *)0x0));
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}